

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_32x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 (*in_RCX) [16];
  long in_RSI;
  undefined8 *in_RDI;
  __m128i *top1;
  undefined8 extraout_XMM0_Qa;
  __m128i *top0;
  __m128i *extraout_XMM0_Qb;
  __m128i r32h;
  __m128i r32l;
  int i;
  __m128i l16;
  __m128i l;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i bh;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i zero;
  __m128i b;
  __m128i a;
  __m128i *in_stack_fffffffffffffd50;
  __m128i *in_stack_fffffffffffffd58;
  __m128i *in_stack_fffffffffffffd60;
  __m128i *in_stack_fffffffffffffd68;
  int local_28c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_1b0;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  
  local_258 = 0x8000800080008000;
  uStack_250 = 0x8000800080008000;
  auVar2 = *in_RCX;
  local_1b0 = in_RDI;
  for (local_28c = 0; local_28c < 0x10; local_28c = local_28c + 1) {
    auVar1._8_8_ = uStack_250;
    auVar1._0_8_ = local_258;
    pshufb(auVar2,auVar1);
    paeth_16x1_pred(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                    in_stack_fffffffffffffd50);
    in_stack_fffffffffffffd58 = top1;
    in_stack_fffffffffffffd60 = top0;
    paeth_16x1_pred(in_stack_fffffffffffffd68,top0,top1,in_stack_fffffffffffffd50);
    *local_1b0 = in_stack_fffffffffffffd58;
    local_1b0[1] = in_stack_fffffffffffffd60;
    local_1b0[2] = extraout_XMM0_Qa;
    local_1b0[3] = extraout_XMM0_Qb;
    local_1b0 = (undefined8 *)(in_RSI + (long)local_1b0);
    local_118 = (short)local_258;
    sStack_116 = (short)((ulong)local_258 >> 0x10);
    sStack_114 = (short)((ulong)local_258 >> 0x20);
    sStack_112 = (short)((ulong)local_258 >> 0x30);
    sStack_110 = (short)uStack_250;
    sStack_10e = (short)((ulong)uStack_250 >> 0x10);
    sStack_10c = (short)((ulong)uStack_250 >> 0x20);
    sStack_10a = (short)((ulong)uStack_250 >> 0x30);
    local_258 = CONCAT26(sStack_112 + 1,
                         CONCAT24(sStack_114 + 1,CONCAT22(sStack_116 + 1,local_118 + 1)));
    uStack_250 = CONCAT26(sStack_10a + 1,
                          CONCAT24(sStack_10c + 1,CONCAT22(sStack_10e + 1,sStack_110 + 1)));
    in_stack_fffffffffffffd50 = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}